

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::Destroy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  string *this_00;
  
  if ((arena == (Arena *)0x0) &&
     (this_00 = (string *)(this->tagged_ptr_).ptr_, this_00 != default_value)) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
    return;
  }
  return;
}

Assistant:

void ArenaStringPtr::Destroy(const std::string* default_value,
                             ::google::protobuf::Arena* arena) {
  if (arena == nullptr) {
    GOOGLE_DCHECK(!IsDonatedString());
    if (!IsDefault(default_value)) {
      delete UnsafeMutablePointer();
    }
  }
}